

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flFTP.cpp
# Opt level: O2

socket_t Rainbow::connectsock(string *host,string *service,string *transport)

{
  socket_t sVar1;
  int iVar2;
  int iVar3;
  servent *psVar4;
  protoent *ppVar5;
  ushort uVar6;
  socket_t sVar7;
  sockaddr_in sin;
  addrinfo *pAip;
  addrinfo local_58;
  
  local_58.ai_flags = 2;
  local_58.ai_family = 2;
  local_58.ai_socktype = 0;
  local_58.ai_protocol = 0;
  local_58.ai_addrlen = 0;
  local_58.ai_addr = (sockaddr *)0x0;
  local_58.ai_canonname = (char *)0x0;
  local_58.ai_next = (addrinfo *)0x0;
  iVar2 = getaddrinfo((host->_M_dataplus)._M_p,(char *)0x0,&local_58,(addrinfo **)&pAip);
  sVar1 = -1;
  sVar7 = sVar1;
  if (iVar2 == 0) {
    if (pAip != (addrinfo *)0x0) {
      sin._0_8_ = *(undefined8 *)pAip->ai_addr;
      sin.sin_zero = *(uchar (*) [8])(pAip->ai_addr->sa_data + 6);
      freeaddrinfo((addrinfo *)pAip);
    }
    psVar4 = getservbyname((service->_M_dataplus)._M_p,(transport->_M_dataplus)._M_p);
    if (psVar4 == (servent *)0x0) {
      iVar2 = std::__cxx11::stoi(service,(size_t *)0x0,10);
      uVar6 = (ushort)iVar2;
      sin.sin_port = uVar6 << 8 | uVar6 >> 8;
      if (uVar6 == 0) {
        return -1;
      }
    }
    else {
      sin.sin_port = (in_port_t)psVar4->s_port;
    }
    ppVar5 = getprotobyname((transport->_M_dataplus)._M_p);
    if (ppVar5 != (protoent *)0x0) {
      iVar2 = strcasecmp(ppVar5->p_name,"tcp");
      iVar2 = socket(2,2 - (uint)(iVar2 == 0),ppVar5->p_proto);
      if ((iVar2 != -1) &&
         (iVar3 = connect(iVar2,(sockaddr *)&sin,0x10), sVar7 = iVar2, iVar3 == -1)) {
        close(iVar2);
        sVar7 = sVar1;
      }
    }
  }
  return sVar7;
}

Assistant:

socket_t connectsock(const std::string &host,
					const std::string &service,
					const std::string &transport)
	{
		struct   sockaddr_in	sin;

#ifdef _WIN32 
		struct   hostent		*pHost;
		struct   servent		*pServen;
		struct   protoent		*pProtocol;

		if(pHost = gethostbyname(host.c_str()))
			memcpy(&sin.sin_addr, pHost->h_addr, pHost->h_length);
		else if((sin.sin_addr.s_addr = inet_addr(host.c_str())) == INADDR_NONE)
			return INVALID_SOCKET;

#endif
#ifdef __linux__ 
		struct   addrinfo		*pAip;
		struct   addrinfo        hint;
		struct	 servent		*pServen;
		struct   protoent		*pProtocol;

		hint.ai_flags = AI_CANONNAME;
		hint.ai_family = AF_INET;
		hint.ai_socktype = 0;
		hint.ai_protocol = 0;
		hint.ai_addrlen = 0;
		hint.ai_canonname = NULL;
		hint.ai_addr = NULL;
		hint.ai_next = NULL;

		if(getaddrinfo(host.c_str(), NULL, &hint, &pAip) != 0)
			return INVALID_SOCKET;
		if(pAip)
		{
			memcpy(&sin, (struct sockaddr_in *)pAip->ai_addr, sizeof(sin));
			freeaddrinfo(pAip);
		}

#endif
		socket_t sd;
		int type;

		if((pServen = getservbyname(service.c_str(), transport.c_str())) != 0)
			sin.sin_port = pServen->s_port;
		else if((sin.sin_port = htons((u_short)std::stoi(service))) == 0)
			return INVALID_SOCKET;

		if((pProtocol = getprotobyname(transport.c_str())) == 0)
			return INVALID_SOCKET;

		if(strcasecmp(pProtocol->p_name, "tcp") == 0)
			type = SOCK_STREAM;
		else
			type = SOCK_DGRAM;

		sd = socket(AF_INET, type, pProtocol->p_proto);
		if(sd == INVALID_SOCKET)
			return INVALID_SOCKET;
		
		if(connect(sd, (sockaddr *)&sin, sizeof(sin)) == SOCKET_ERROR)
		{
			closesocket(sd);
			return INVALID_SOCKET;
		}

		return sd;
	}